

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                   (string *__return_storage_ptr__,char (*arg) [7],int *args,char (*args_1) [5],
                   int *args_2,char (*args_3) [5],int *args_4,char (*args_5) [4])

{
  string local_70;
  string local_50;
  
  StringBuilder_abi_cxx11_(&local_50,*arg);
  StringBuilder<int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
            (&local_70,args,args_1,args_2,args_3,args_4,args_5);
  std::operator+(__return_storage_ptr__,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}